

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::
foreach<Ptex::v2_4::PtexReaderCache::Purger>
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this,Purger *fn)

{
  Entry *pEVar1;
  PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *in_RDI;
  PtexCachedReader *v;
  uint32_t i;
  Entry *entries;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar2;
  
  pEVar1 = getEntries(in_RDI);
  for (uVar2 = 0; uVar2 < in_RDI->_numEntries; uVar2 = uVar2 + 1) {
    if (pEVar1[uVar2].value != (PtexCachedReader *)0x0) {
      PtexReaderCache::Purger::operator()
                ((Purger *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),pEVar1[uVar2].value);
    }
  }
  return;
}

Assistant:

void foreach(Fn& fn)
    {
        Entry* entries = getEntries();
        for (uint32_t i = 0; i < _numEntries; ++i) {
            Value v = entries[i].value;
            if (v) fn(v);
        }
    }